

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

int __thiscall
QItemSelectionModel::select
          (QItemSelectionModel *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  QItemSelection *this_00;
  QItemSelection *this_01;
  QItemSelectionModelPrivate *this_02;
  parameter_type pQVar1;
  fd_set *__writefds_00;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> command;
  undefined4 in_register_00000034;
  fd_set *pfVar2;
  fd_set *__readfds_00;
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *this_03;
  long in_FS_OFFSET;
  QArrayDataPointer<QItemSelectionRange> local_a8;
  QArrayDataPointer<QItemSelectionRange> local_90;
  QArrayDataPointer<QItemSelectionRange> local_78;
  QArrayDataPointer<QItemSelectionRange> local_58;
  long local_38;
  
  pfVar2 = (fd_set *)CONCAT44(in_register_00000034,__nfds);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = *(QItemSelectionModelPrivate **)(this + 8);
  this_03 = &this_02->model;
  __readfds_00 = pfVar2;
  pQVar1 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
           ::value(this_03);
  if (pQVar1 == (parameter_type)0x0) {
    select((int)this_03,__readfds_00,__writefds_00,__writefds,(timeval *)__exceptfds);
  }
  else {
    command.i = (Int)__readfds;
    if ((QFlagsStorage<QItemSelectionModel::SelectionFlag>)command.i !=
        (QFlagsStorage<QItemSelectionModel::SelectionFlag>)0x0) {
      local_78.d = (Data *)pfVar2->fds_bits[0];
      local_78.ptr = (QItemSelectionRange *)pfVar2->fds_bits[1];
      local_78.size = pfVar2->fds_bits[2];
      if (local_78.d != (Data *)0x0) {
        LOCK();
        ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      this_00 = &this_02->ranges;
      QList<QItemSelectionRange>::removeIf<(anonymous_namespace)::QtFunctionObjects::IsNotValid>
                (&this_00->super_QList<QItemSelectionRange>);
      local_90.d = (this_02->ranges).super_QList<QItemSelectionRange>.d.d;
      local_90.ptr = (this_02->ranges).super_QList<QItemSelectionRange>.d.ptr;
      local_90.size = (this_02->ranges).super_QList<QItemSelectionRange>.d.size;
      if (local_90.d != (Data *)0x0) {
        LOCK();
        ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      this_01 = &this_02->currentSelection;
      QItemSelection::merge
                ((QItemSelection *)&local_90,this_01,
                 (SelectionFlags)
                 (this_02->currentCommand).
                 super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                 super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
      if (((ulong)__readfds & 0x60) != 0) {
        QItemSelectionModelPrivate::expandSelection
                  ((QItemSelection *)&local_a8,this_02,(QItemSelection *)&local_78,
                   (SelectionFlags)command.i);
        local_58.size = local_78.size;
        local_58.ptr = local_78.ptr;
        local_58.d = local_78.d;
        local_78.size = local_a8.size;
        local_78.ptr = local_a8.ptr;
        local_78.d = local_a8.d;
        local_a8.size = 0;
        local_a8.d = (Data *)0x0;
        local_a8.ptr = (QItemSelectionRange *)0x0;
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_a8);
      }
      if (((ulong)__readfds & 1) != 0) {
        QList<QItemSelectionRange>::clear(&this_00->super_QList<QItemSelectionRange>);
        QList<QItemSelectionRange>::clear(&this_01->super_QList<QItemSelectionRange>);
      }
      if (((ulong)__readfds & 0x10) == 0) {
        QItemSelection::merge
                  (this_00,this_01,
                   (SelectionFlags)
                   (this_02->currentCommand).
                   super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                   super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
        if ((this_02->currentSelection).super_QList<QItemSelectionRange>.d.size != 0) {
          QList<QItemSelectionRange>::clear(&this_01->super_QList<QItemSelectionRange>);
        }
      }
      if (((ulong)__readfds & 0xe) != 0) {
        (this_02->currentCommand).super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
        super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i = command.i;
        QArrayDataPointer<QItemSelectionRange>::operator=
                  ((QArrayDataPointer<QItemSelectionRange> *)this_01,&local_78);
      }
      local_58.d = (this_02->ranges).super_QList<QItemSelectionRange>.d.d;
      local_58.ptr = (this_02->ranges).super_QList<QItemSelectionRange>.d.ptr;
      local_58.size = (this_02->ranges).super_QList<QItemSelectionRange>.d.size;
      if (local_58.d != (Data *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QItemSelection::merge
                ((QItemSelection *)&local_58,this_01,
                 (SelectionFlags)
                 (this_02->currentCommand).
                 super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                 super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
      emitSelectionChanged(this,(QItemSelection *)&local_58,(QItemSelection *)&local_90);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_90);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QItemSelectionModel::select(const QItemSelection &selection, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QItemSelectionModel);
    if (!d->model.value()) {
        qWarning("QItemSelectionModel: Selecting when no model has been set will result in a no-op.");
        return;
    }
    if (command == NoUpdate)
        return;

    // store old selection
    QItemSelection sel = selection;
    // If d->ranges is non-empty when the source model is reset the persistent indexes
    // it contains will be invalid. We can't clear them in a modelReset slot because that might already
    // be too late if another model observer is connected to the same modelReset slot and is invoked first
    // it might call select() on this selection model before any such QItemSelectionModelPrivate::modelReset() slot
    // is invoked, so it would not be cleared yet. We clear it invalid ranges in it here.
    d->ranges.removeIf(QtFunctionObjects::IsNotValid());

    QItemSelection old = d->ranges;
    old.merge(d->currentSelection, d->currentCommand);

    // expand selection according to SelectionBehavior
    if (command & Rows || command & Columns)
        sel = d->expandSelection(sel, command);

    // clear ranges and currentSelection
    if (command & Clear) {
        d->ranges.clear();
        d->currentSelection.clear();
    }

    // merge and clear currentSelection if Current was not set (ie. start new currentSelection)
    if (!(command & Current))
        d->finalize();

    // update currentSelection
    if (command & Toggle || command & Select || command & Deselect) {
        d->currentCommand = command;
        d->currentSelection = sel;
    }

    // generate new selection, compare with old and emit selectionChanged()
    QItemSelection newSelection = d->ranges;
    newSelection.merge(d->currentSelection, d->currentCommand);
    emitSelectionChanged(newSelection, old);
}